

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

function_map * skiwi::generate_function_map_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  *in_RDI;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_40;
  
  *(undefined4 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  *(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
    **)(in_RDI + 0x18) = in_RDI + 8;
  *(_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
    **)(in_RDI + 0x20) = in_RDI + 8;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  paVar1 = &local_40.first.field_2;
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"+","");
  local_40.second = compile_add;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"-","");
  local_40.second = compile_sub;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"*","");
  local_40.second = compile_mul;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"/","");
  local_40.second = compile_div;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"=","");
  local_40.second = compile_equal;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"!=","");
  local_40.second = compile_not_equal;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"<","");
  local_40.second = compile_less;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"<=","");
  local_40.second = compile_leq;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,">","");
  local_40.second = compile_greater;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,">=","");
  local_40.second = compile_geq;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"%allocate-symbol","");
  local_40.second = compile_allocate_symbol;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"%slot-ref","");
  local_40.second = compile_slot_ref;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"%slot-set!","");
  local_40.second = compile_slot_set;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"%undefined","");
  local_40.second = compile_undefined;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"%quiet-undefined","");
  local_40.second = compile_skiwi_quiet_undefined;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"add1","");
  local_40.second = compile_add1;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"%apply","");
  local_40.second = compile_apply;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"arithmetic-shift","");
  local_40.second = compile_arithmetic_shift;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"assoc","");
  local_40.second = compile_assoc;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"assq","");
  local_40.second = compile_assq;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"assv","");
  local_40.second = compile_assv;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"bitwise-and","");
  local_40.second = compile_bitwise_and;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"bitwise-not","");
  local_40.second = compile_bitwise_not;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"bitwise-or","");
  local_40.second = compile_bitwise_or;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"bitwise-xor","");
  local_40.second = compile_bitwise_xor;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"boolean?","");
  local_40.second = compile_is_boolean;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"car","");
  local_40.second = compile_car;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"cdr","");
  local_40.second = compile_cdr;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"char?","");
  local_40.second = compile_is_char;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"char=?","");
  local_40.second = compile_char_equal;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"char<?","");
  local_40.second = compile_char_less;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"char>?","");
  local_40.second = compile_char_greater;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"char<=?","");
  local_40.second = compile_char_leq;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"char>=?","");
  local_40.second = compile_char_geq;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"char->fixnum","");
  local_40.second = compile_char_to_fixnum;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"close-file","");
  local_40.second = compile_close_file;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"closure","");
  local_40.second = compile_closure;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"closure?","");
  local_40.second = compile_is_closure;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"closure-ref","");
  local_40.second = compile_closure_ref;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"cons","");
  local_40.second = compile_cons;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"compare-strings","");
  local_40.second = compile_compare_strings;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"compare-strings-ci","");
  local_40.second = compile_compare_strings_ci;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"current-seconds","");
  local_40.second = compile_current_seconds;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"current-milliseconds","");
  local_40.second = compile_current_milliseconds;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"eof-object?","");
  local_40.second = compile_is_eof_object;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"eq?","");
  local_40.second = compile_is_eq;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"eqv?","");
  local_40.second = compile_is_eqv;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"%eqv?","");
  local_40.second = compile_is_eqv_structurally;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"equal?","");
  local_40.second = compile_is_equal;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"%error","");
  local_40.second = compile_error;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"%eval","");
  local_40.second = compile_eval;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"file-exists?","");
  local_40.second = compile_file_exists;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"fixnum?","");
  local_40.second = compile_is_fixnum;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"fixnum->char","");
  local_40.second = compile_fixnum_to_char;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"fixnum->flonum","");
  local_40.second = compile_fixnum_to_flonum;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"fixnum-expt","");
  local_40.second = compile_fixnum_expt;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"flonum?","");
  local_40.second = compile_is_flonum;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"flonum->fixnum","");
  local_40.second = compile_flonum_to_fixnum;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"flonum-expt","");
  local_40.second = compile_flonum_expt;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"%flush-output-port","");
  local_40.second = compile_flush_output_port;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"fx=?","");
  local_40.second = compile_fx_equal;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"fx<?","");
  local_40.second = compile_fx_less;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"fx>?","");
  local_40.second = compile_fx_greater;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"fx<=?","");
  local_40.second = compile_fx_leq;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"fx>=?","");
  local_40.second = compile_fx_geq;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"fx+","");
  local_40.second = compile_fx_add;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"fx-","");
  local_40.second = compile_fx_sub;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"fx*","");
  local_40.second = compile_fx_mul;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"fx/","");
  local_40.second = compile_fx_div;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"fxadd1","");
  local_40.second = compile_fx_add1;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"fxsub1","");
  local_40.second = compile_fx_sub1;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"fxzero?","");
  local_40.second = compile_fx_is_zero;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"getenv","");
  local_40.second = compile_getenv;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"halt","");
  local_40.second = compile_halt;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ieee754-sign","");
  local_40.second = compile_ieee754_sign;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ieee754-exponent","");
  local_40.second = compile_ieee754_exponent;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ieee754-mantissa","");
  local_40.second = compile_ieee754_mantissa;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ieee754-sin","");
  local_40.second = compile_ieee754_sin;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ieee754-cos","");
  local_40.second = compile_ieee754_cos;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ieee754-tan","");
  local_40.second = compile_ieee754_tan;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ieee754-asin","");
  local_40.second = compile_ieee754_asin;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ieee754-acos","");
  local_40.second = compile_ieee754_acos;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ieee754-atan1","");
  local_40.second = compile_ieee754_atan1;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ieee754-log","");
  local_40.second = compile_ieee754_log;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ieee754-round","");
  local_40.second = compile_ieee754_round;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ieee754-sqrt","");
  local_40.second = compile_ieee754_sqrt;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ieee754-truncate","");
  local_40.second = compile_ieee754_truncate;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"ieee754-pi","");
  local_40.second = compile_ieee754_pi;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"input-port?","");
  local_40.second = compile_is_input_port;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"load","");
  local_40.second = compile_load;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"length","");
  local_40.second = compile_length;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"list","");
  local_40.second = compile_list;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"make-port","");
  local_40.second = compile_make_port;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"%make-promise","");
  local_40.second = compile_make_promise;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"make-string","");
  local_40.second = compile_make_string;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"make-vector","");
  local_40.second = compile_make_vector;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"max","");
  local_40.second = compile_max;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"member","");
  local_40.second = compile_member;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"memq","");
  local_40.second = compile_memq;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"memv","");
  local_40.second = compile_memv;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"min","");
  local_40.second = compile_min;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"not","");
  local_40.second = compile_not;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"null?","");
  local_40.second = compile_is_nil;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"num2str","");
  local_40.second = compile_num2str;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"open-file","");
  local_40.second = compile_open_file;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"output-port?","");
  local_40.second = compile_is_output_port;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"%peek-char","");
  local_40.second = compile_peek_char;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"pair?","");
  local_40.second = compile_is_pair;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"port?","");
  local_40.second = compile_is_port;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"procedure?","");
  local_40.second = compile_is_procedure;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"promise?","");
  local_40.second = compile_is_promise;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"putenv","");
  local_40.second = compile_putenv;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"quotient","");
  local_40.second = compile_quotient;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"%read-char","");
  local_40.second = compile_read_char;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"reclaim","");
  local_40.second = compile_reclaim;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"reclaim-garbage","");
  local_40.second = compile_reclaim_garbage;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"remainder","");
  local_40.second = compile_remainder;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"set-car!","");
  local_40.second = compile_set_car;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"set-cdr!","");
  local_40.second = compile_set_cdr;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"str2num","");
  local_40.second = compile_str2num;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"string","");
  local_40.second = compile_string;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"string-hash","");
  local_40.second = compile_string_hash;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"string?","");
  local_40.second = compile_is_string;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"string-append1","");
  local_40.second = compile_string_append1;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"string-copy","");
  local_40.second = compile_string_copy;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"string-fill!","");
  local_40.second = compile_string_fill;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"string-length","");
  local_40.second = compile_string_length;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"string-ref","");
  local_40.second = compile_string_ref;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"string-set!","");
  local_40.second = compile_string_set;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"substring","");
  local_40.second = compile_substring;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"symbol->string","");
  local_40.second = compile_symbol_to_string;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"symbol?","");
  local_40.second = compile_is_symbol;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"sub1","");
  local_40.second = compile_sub1;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"vector","");
  local_40.second = compile_vector;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"vector?","");
  local_40.second = compile_is_vector;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"vector-fill!","");
  local_40.second = compile_vector_fill;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"vector-length","");
  local_40.second = compile_vector_length;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"vector-ref","");
  local_40.second = compile_vector_ref;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"vector-set!","");
  local_40.second = compile_vector_set;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"%write-char","");
  local_40.second = compile_write_char;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"%write-string","");
  local_40.second = compile_write_string;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_40.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"zero?","");
  local_40.second = compile_is_zero;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>,std::_Select1st<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  _M_emplace_unique<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_40.first._M_dataplus._M_p,local_40.first.field_2._M_allocated_capacity + 1
                   );
  }
  return (function_map *)in_RDI;
}

Assistant:

function_map generate_function_map()
  {
  function_map fm;
  fm.insert(std::pair<std::string, fun_ptr>("+", &compile_add));
  fm.insert(std::pair<std::string, fun_ptr>("-", &compile_sub));
  fm.insert(std::pair<std::string, fun_ptr>("*", &compile_mul));
  fm.insert(std::pair<std::string, fun_ptr>("/", &compile_div));
  fm.insert(std::pair<std::string, fun_ptr>("=", &compile_equal));
  fm.insert(std::pair<std::string, fun_ptr>("!=", &compile_not_equal));
  fm.insert(std::pair<std::string, fun_ptr>("<", &compile_less));
  fm.insert(std::pair<std::string, fun_ptr>("<=", &compile_leq));
  fm.insert(std::pair<std::string, fun_ptr>(">", &compile_greater));
  fm.insert(std::pair<std::string, fun_ptr>(">=", &compile_geq));
  fm.insert(std::pair<std::string, fun_ptr>("%allocate-symbol", &compile_allocate_symbol));
  fm.insert(std::pair<std::string, fun_ptr>("%slot-ref", &compile_slot_ref));
  fm.insert(std::pair<std::string, fun_ptr>("%slot-set!", &compile_slot_set));
  fm.insert(std::pair<std::string, fun_ptr>("%undefined", &compile_undefined));
  fm.insert(std::pair<std::string, fun_ptr>("%quiet-undefined", &compile_skiwi_quiet_undefined));
  fm.insert(std::pair<std::string, fun_ptr>("add1", &compile_add1));
  fm.insert(std::pair<std::string, fun_ptr>("%apply", &compile_apply));
  fm.insert(std::pair<std::string, fun_ptr>("arithmetic-shift", &compile_arithmetic_shift));
  fm.insert(std::pair<std::string, fun_ptr>("assoc", &compile_assoc));
  fm.insert(std::pair<std::string, fun_ptr>("assq", &compile_assq));
  fm.insert(std::pair<std::string, fun_ptr>("assv", &compile_assv));
  fm.insert(std::pair<std::string, fun_ptr>("bitwise-and", &compile_bitwise_and));
  fm.insert(std::pair<std::string, fun_ptr>("bitwise-not", &compile_bitwise_not));
  fm.insert(std::pair<std::string, fun_ptr>("bitwise-or", &compile_bitwise_or));
  fm.insert(std::pair<std::string, fun_ptr>("bitwise-xor", &compile_bitwise_xor));
  fm.insert(std::pair<std::string, fun_ptr>("boolean?", &compile_is_boolean));
  fm.insert(std::pair<std::string, fun_ptr>("car", &compile_car));
  fm.insert(std::pair<std::string, fun_ptr>("cdr", &compile_cdr));
  fm.insert(std::pair<std::string, fun_ptr>("char?", &compile_is_char));
  fm.insert(std::pair<std::string, fun_ptr>("char=?", &compile_char_equal));
  fm.insert(std::pair<std::string, fun_ptr>("char<?", &compile_char_less));
  fm.insert(std::pair<std::string, fun_ptr>("char>?", &compile_char_greater));
  fm.insert(std::pair<std::string, fun_ptr>("char<=?", &compile_char_leq));
  fm.insert(std::pair<std::string, fun_ptr>("char>=?", &compile_char_geq));
  fm.insert(std::pair<std::string, fun_ptr>("char->fixnum", &compile_char_to_fixnum));
  fm.insert(std::pair<std::string, fun_ptr>("close-file", &compile_close_file));
  fm.insert(std::pair<std::string, fun_ptr>("closure", &compile_closure));
  fm.insert(std::pair<std::string, fun_ptr>("closure?", &compile_is_closure));
  fm.insert(std::pair<std::string, fun_ptr>("closure-ref", &compile_closure_ref));
  fm.insert(std::pair<std::string, fun_ptr>("cons", &compile_cons));
  fm.insert(std::pair<std::string, fun_ptr>("compare-strings", &compile_compare_strings));
  fm.insert(std::pair<std::string, fun_ptr>("compare-strings-ci", &compile_compare_strings_ci));
  fm.insert(std::pair<std::string, fun_ptr>("current-seconds", &compile_current_seconds));
  fm.insert(std::pair<std::string, fun_ptr>("current-milliseconds", &compile_current_milliseconds));
  fm.insert(std::pair<std::string, fun_ptr>("eof-object?", &compile_is_eof_object));
  fm.insert(std::pair<std::string, fun_ptr>("eq?", &compile_is_eq));
  fm.insert(std::pair<std::string, fun_ptr>("eqv?", &compile_is_eqv));
  fm.insert(std::pair<std::string, fun_ptr>("%eqv?", &compile_is_eqv_structurally));
  fm.insert(std::pair<std::string, fun_ptr>("equal?", &compile_is_equal));
  fm.insert(std::pair<std::string, fun_ptr>("%error", &compile_error));
  fm.insert(std::pair<std::string, fun_ptr>("%eval", &compile_eval));
  fm.insert(std::pair<std::string, fun_ptr>("file-exists?", &compile_file_exists));
  fm.insert(std::pair<std::string, fun_ptr>("fixnum?", &compile_is_fixnum));
  fm.insert(std::pair<std::string, fun_ptr>("fixnum->char", &compile_fixnum_to_char));
  fm.insert(std::pair<std::string, fun_ptr>("fixnum->flonum", &compile_fixnum_to_flonum));
  fm.insert(std::pair<std::string, fun_ptr>("fixnum-expt", &compile_fixnum_expt));
  fm.insert(std::pair<std::string, fun_ptr>("flonum?", &compile_is_flonum));
  fm.insert(std::pair<std::string, fun_ptr>("flonum->fixnum", &compile_flonum_to_fixnum));
  fm.insert(std::pair<std::string, fun_ptr>("flonum-expt", &compile_flonum_expt));
  fm.insert(std::pair<std::string, fun_ptr>("%flush-output-port", &compile_flush_output_port));
  fm.insert(std::pair<std::string, fun_ptr>("fx=?", &compile_fx_equal));
  fm.insert(std::pair<std::string, fun_ptr>("fx<?", &compile_fx_less));
  fm.insert(std::pair<std::string, fun_ptr>("fx>?", &compile_fx_greater));
  fm.insert(std::pair<std::string, fun_ptr>("fx<=?", &compile_fx_leq));
  fm.insert(std::pair<std::string, fun_ptr>("fx>=?", &compile_fx_geq));
  fm.insert(std::pair<std::string, fun_ptr>("fx+", &compile_fx_add));
  fm.insert(std::pair<std::string, fun_ptr>("fx-", &compile_fx_sub));
  fm.insert(std::pair<std::string, fun_ptr>("fx*", &compile_fx_mul));
  fm.insert(std::pair<std::string, fun_ptr>("fx/", &compile_fx_div));
  fm.insert(std::pair<std::string, fun_ptr>("fxadd1", &compile_fx_add1));
  fm.insert(std::pair<std::string, fun_ptr>("fxsub1", &compile_fx_sub1));
  fm.insert(std::pair<std::string, fun_ptr>("fxzero?", &compile_fx_is_zero));
  fm.insert(std::pair<std::string, fun_ptr>("getenv", &compile_getenv));
  fm.insert(std::pair<std::string, fun_ptr>("halt", &compile_halt));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-sign", &compile_ieee754_sign));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-exponent", &compile_ieee754_exponent));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-mantissa", &compile_ieee754_mantissa));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-sin", &compile_ieee754_sin));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-cos", &compile_ieee754_cos));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-tan", &compile_ieee754_tan));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-asin", &compile_ieee754_asin));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-acos", &compile_ieee754_acos));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-atan1", &compile_ieee754_atan1));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-log", &compile_ieee754_log));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-round", &compile_ieee754_round));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-sqrt", &compile_ieee754_sqrt));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-truncate", &compile_ieee754_truncate));
  fm.insert(std::pair<std::string, fun_ptr>("ieee754-pi", &compile_ieee754_pi));
  fm.insert(std::pair<std::string, fun_ptr>("input-port?", &compile_is_input_port));
  fm.insert(std::pair<std::string, fun_ptr>("load", &compile_load));
  fm.insert(std::pair<std::string, fun_ptr>("length", &compile_length));
  fm.insert(std::pair<std::string, fun_ptr>("list", &compile_list));
  fm.insert(std::pair<std::string, fun_ptr>("make-port", &compile_make_port));
  fm.insert(std::pair<std::string, fun_ptr>("%make-promise", &compile_make_promise));
  fm.insert(std::pair<std::string, fun_ptr>("make-string", &compile_make_string));
  fm.insert(std::pair<std::string, fun_ptr>("make-vector", &compile_make_vector));
  fm.insert(std::pair<std::string, fun_ptr>("max", &compile_max));
  fm.insert(std::pair<std::string, fun_ptr>("member", &compile_member));
  fm.insert(std::pair<std::string, fun_ptr>("memq", &compile_memq));
  fm.insert(std::pair<std::string, fun_ptr>("memv", &compile_memv));
  fm.insert(std::pair<std::string, fun_ptr>("min", &compile_min));
  fm.insert(std::pair<std::string, fun_ptr>("not", &compile_not));
  fm.insert(std::pair<std::string, fun_ptr>("null?", &compile_is_nil));
  fm.insert(std::pair<std::string, fun_ptr>("num2str", &compile_num2str));
  fm.insert(std::pair<std::string, fun_ptr>("open-file", &compile_open_file));
  fm.insert(std::pair<std::string, fun_ptr>("output-port?", &compile_is_output_port));
  fm.insert(std::pair<std::string, fun_ptr>("%peek-char", &compile_peek_char));
  fm.insert(std::pair<std::string, fun_ptr>("pair?", &compile_is_pair));
  fm.insert(std::pair<std::string, fun_ptr>("port?", &compile_is_port));
  fm.insert(std::pair<std::string, fun_ptr>("procedure?", &compile_is_procedure));
  fm.insert(std::pair<std::string, fun_ptr>("promise?", &compile_is_promise));
  fm.insert(std::pair<std::string, fun_ptr>("putenv", &compile_putenv));
  fm.insert(std::pair<std::string, fun_ptr>("quotient", &compile_quotient));
  fm.insert(std::pair<std::string, fun_ptr>("%read-char", &compile_read_char));
  fm.insert(std::pair<std::string, fun_ptr>("reclaim", &compile_reclaim));
  fm.insert(std::pair<std::string, fun_ptr>("reclaim-garbage", &compile_reclaim_garbage));
  fm.insert(std::pair<std::string, fun_ptr>("remainder", &compile_remainder));
  fm.insert(std::pair<std::string, fun_ptr>("set-car!", &compile_set_car));
  fm.insert(std::pair<std::string, fun_ptr>("set-cdr!", &compile_set_cdr));
  fm.insert(std::pair<std::string, fun_ptr>("str2num", &compile_str2num));
  fm.insert(std::pair<std::string, fun_ptr>("string", &compile_string));
  fm.insert(std::pair<std::string, fun_ptr>("string-hash", &compile_string_hash));
  fm.insert(std::pair<std::string, fun_ptr>("string?", &compile_is_string));
  fm.insert(std::pair<std::string, fun_ptr>("string-append1", &compile_string_append1));
  fm.insert(std::pair<std::string, fun_ptr>("string-copy", &compile_string_copy));
  fm.insert(std::pair<std::string, fun_ptr>("string-fill!", &compile_string_fill));
  fm.insert(std::pair<std::string, fun_ptr>("string-length", &compile_string_length));
  fm.insert(std::pair<std::string, fun_ptr>("string-ref", &compile_string_ref));
  fm.insert(std::pair<std::string, fun_ptr>("string-set!", &compile_string_set));
  fm.insert(std::pair<std::string, fun_ptr>("substring", &compile_substring));
  fm.insert(std::pair<std::string, fun_ptr>("symbol->string", &compile_symbol_to_string));
  fm.insert(std::pair<std::string, fun_ptr>("symbol?", &compile_is_symbol));
  fm.insert(std::pair<std::string, fun_ptr>("sub1", &compile_sub1));
  fm.insert(std::pair<std::string, fun_ptr>("vector", &compile_vector));
  fm.insert(std::pair<std::string, fun_ptr>("vector?", &compile_is_vector));
  fm.insert(std::pair<std::string, fun_ptr>("vector-fill!", &compile_vector_fill));
  fm.insert(std::pair<std::string, fun_ptr>("vector-length", &compile_vector_length));
  fm.insert(std::pair<std::string, fun_ptr>("vector-ref", &compile_vector_ref));
  fm.insert(std::pair<std::string, fun_ptr>("vector-set!", &compile_vector_set));
  fm.insert(std::pair<std::string, fun_ptr>("%write-char", &compile_write_char));
  fm.insert(std::pair<std::string, fun_ptr>("%write-string", &compile_write_string));
  fm.insert(std::pair<std::string, fun_ptr>("zero?", &compile_is_zero));
  return fm;
  }